

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrome_trace_converter.cpp
# Opt level: O2

string * __thiscall
HawkTracer::client::ChromeTraceConverter::_get_args_abi_cxx11_
          (string *__return_storage_ptr__,ChromeTraceConverter *this,Event *event)

{
  int iVar1;
  iterator iVar2;
  Value *value;
  bool bVar3;
  string *psVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_15d;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if (_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                                 core_fields_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_f0,"thread_id",(allocator *)&local_150);
      std::__cxx11::string::string(local_d0,"timestamp",(allocator *)&local_110);
      std::__cxx11::string::string(local_b0,"klass_id",(allocator *)&local_130);
      std::__cxx11::string::string(local_90,"id",&local_159);
      std::__cxx11::string::string(local_70,"label",&local_15a);
      std::__cxx11::string::string(local_50,"duration",&local_15b);
      __l._M_len = 6;
      __l._M_array = &local_f0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_,__l,
            &local_15c,&local_15d);
      lVar5 = 0xa0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_f0._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                           core_fields_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                           core_fields_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar4 = &(this->super_Converter)._mapping_klass_name;
  bVar3 = true;
  local_158 = __return_storage_ptr__;
  while (psVar4 = (string *)(psVar4->_M_dataplus)._M_p, psVar4 != (string *)0x0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_.
                    _M_t,(key_type *)&psVar4->_M_string_length);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_._M_t._M_impl
         .super__Rb_tree_header) {
      if (!bVar3) {
        std::__cxx11::string::append((char *)local_158);
      }
      std::operator+(&local_110,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &psVar4->_M_string_length);
      std::operator+(&local_150,&local_110,"\": ");
      _get_json_value_abi_cxx11_(&local_130,(ChromeTraceConverter *)((long)(psVar4 + 1) + 8),value);
      std::operator+(&local_f0,&local_150,&local_130);
      std::__cxx11::string::append((string *)local_158);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      bVar3 = false;
    }
  }
  return local_158;
}

Assistant:

std::string ChromeTraceConverter::_get_args(const parser::Event& event)
{
    static std::set<std::string> core_fields = {"thread_id", "timestamp", "klass_id", "id", "label", "duration"};

    std::string ret;
    bool is_first = true;

    for (const auto& value : event.get_values())
    {
        if (core_fields.find(value.first) != core_fields.end())
        {
            continue;
        }
        if (is_first)
        {
            is_first = false;
        }
        else
        {
            ret += ",";
        }
        ret += "\"" + value.first + "\": " + _get_json_value(value.second);
    }
    return ret;
}